

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinHeap.h
# Opt level: O2

int __thiscall sznet::MinHeap<sznet::Timer>::erase(MinHeap<sznet::Timer> *this,Timer *e)

{
  Timer *e_00;
  int iVar1;
  uint uVar2;
  uint32_t hole_index;
  
  hole_index = (e->super_MinHeaBaseElem).min_heap_idx;
  if (hole_index == 0xffffffff) {
    return -1;
  }
  uVar2 = this->m_size - 1;
  this->m_size = uVar2;
  e_00 = this->m_ptrArr[uVar2];
  if (0 < (int)hole_index) {
    iVar1 = (*this->m_pCmpFunc)(this->m_ptrArr[hole_index - 1 >> 1],e_00);
    hole_index = (e->super_MinHeaBaseElem).min_heap_idx;
    if (iVar1 == 1) {
      shiftUp_(this,hole_index,e_00);
      goto LAB_0011758e;
    }
  }
  shiftDown_(this,hole_index,e_00);
LAB_0011758e:
  (e->super_MinHeaBaseElem).min_heap_idx = -1;
  return 0;
}

Assistant:

int erase(T* e)
	{
		if (-1 != e->min_heap_idx)
		{
			// 用最后的元素值替代被删除的结点
			T* last = m_ptrArr[--m_size];
			// 要删除元素的父亲元素下标
			uint32_t parent_index = parent(e->min_heap_idx);
			// 不是根节点 并且 要删除元素小于父结点，需要向上调整
			if (e->min_heap_idx > 0 && m_pCmpFunc(m_ptrArr[parent_index], last) == 1)
			{
				// 从删除元素的下标处向上给last找个合适的位置
				shiftUp_(e->min_heap_idx, last);
			}
			// 最后元素大于父结点，需要向下调整
			else
			{
				// 从删除元素的下标处向下给last找个合适的位置
				shiftDown_(e->min_heap_idx, last);
			}
			e->min_heap_idx = -1;

			return 0;
		}

		return -1;
	}